

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowlev1.c
# Opt level: O0

LispPTR N_OP_putbasen(LispPTR base,LispPTR tos,int n)

{
  DLword *pDVar1;
  int n_local;
  LispPTR tos_local;
  LispPTR base_local;
  
  tos_local = base & 0xfffffff;
  if ((tos & 0xfff0000) == 0xe0000) {
    pDVar1 = NativeAligned2FromLAddr(tos_local + n);
    *(short *)((ulong)pDVar1 ^ 2) = (short)tos;
  }
  else {
    MachineState.errorexit = 1;
    tos_local = 0xffffffff;
    MachineState.tosvalue = tos;
  }
  return tos_local;
}

Assistant:

LispPTR N_OP_putbasen(LispPTR base, LispPTR tos, int n) {
  base = POINTERMASK & base;
  if ((SEGMASK & tos) != S_POSITIVE) {
    ERROR_EXIT(tos);
  } else {
    GETWORD(NativeAligned2FromLAddr(base + n)) = GetLoWord(tos);
    return (base);
  }
}